

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

int Abs_ManSupport3(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  Gia_Obj_t *pObj_02;
  int iVar4;
  
  Abs_ManSupport2(p,pObj,vSupp);
  iVar1 = Abs_GiaSortNodes(p,vSupp);
  if (iVar1 < 1) {
    __assert_fail("nSize0 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x218,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  iVar4 = 0;
LAB_00495a1a:
  while( true ) {
    if (vSupp->nSize <= iVar4) {
      return vSupp->nSize;
    }
    iVar2 = Vec_IntEntry(vSupp,iVar4);
    pObj_00 = Gia_ManObj(p,iVar2);
    if (pObj_00 == (Gia_Obj_t *)0x0) {
      return vSupp->nSize;
    }
    if ((iVar1 <= iVar4) &&
       (uVar3 = (uint)*(ulong *)pObj_00, (~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3)) break;
LAB_00495a65:
    iVar4 = iVar4 + 1;
  }
  if ((*(ulong *)pObj_00 >> 0x3e & 1) != 0) {
    __assert_fail("!pTemp->fMark1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x223,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  iVar2 = Gia_ObjRefNum(p,pObj_00);
  if (iVar2 < 1) {
    __assert_fail("Gia_ObjRefNum(p, pTemp) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                  ,0x224,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  pObj_02 = pObj_00 + -(*(ulong *)pObj_00 & 0x1fffffff);
  pObj_01 = pObj_00 + -(*(ulong *)pObj_00 >> 0x20 & 0x1fffffff);
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj_02);
  if ((iVar2 == 0) || (iVar2 = Gia_ObjIsTravIdCurrent(p,pObj_01), iVar2 == 0)) {
    iVar2 = Gia_ObjIsTravIdCurrent(p,pObj_02);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsTravIdCurrent(p,pObj_01);
      if (iVar2 == 0) goto LAB_00495a65;
      iVar4 = Gia_ObjId(p,pObj_00);
      Vec_IntRemove(vSupp,iVar4);
      iVar4 = Gia_ObjId(p,pObj_02);
      Vec_IntPush(vSupp,iVar4);
      iVar4 = Gia_ObjIsTravIdCurrent(p,pObj_02);
      if (iVar4 != 0) {
        __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                      ,0x23a,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      Gia_ObjSetTravIdCurrent(p,pObj_02);
      iVar4 = 0;
      goto LAB_00495a1a;
    }
    iVar4 = Gia_ObjId(p,pObj_00);
    Vec_IntRemove(vSupp,iVar4);
    iVar4 = Gia_ObjId(p,pObj_01);
    Vec_IntPush(vSupp,iVar4);
    iVar4 = Gia_ObjIsTravIdCurrent(p,pObj_01);
    if (iVar4 != 0) {
      __assert_fail("!Gia_ObjIsTravIdCurrent(p, pFan1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                    ,0x231,"int Abs_ManSupport3(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Gia_ObjSetTravIdCurrent(p,pObj_01);
  }
  else {
    iVar4 = Gia_ObjId(p,pObj_00);
    Vec_IntRemove(vSupp,iVar4);
  }
  iVar4 = 0;
  goto LAB_00495a1a;
}

Assistant:

int Abs_ManSupport3( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pTemp, * pFan0, * pFan1;
    int i, nSize0;
    // collect MFFC
    Abs_ManSupport2( p, pObj, vSupp );
    // move dominated to the front
    nSize0 = Abs_GiaSortNodes( p, vSupp );
    assert( nSize0 > 0 );
    // consider remaining nodes
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObjVec( vSupp, p, pTemp, i )
        {
            if ( i < nSize0 )
                continue;
            if ( !Gia_ObjIsAnd(pTemp) )
                continue;
            assert( !pTemp->fMark1 );
            assert( Gia_ObjRefNum(p, pTemp) > 0 );
            pFan0 = Gia_ObjFanin0(pTemp);
            pFan1 = Gia_ObjFanin1(pTemp);
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) && Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan0) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan1) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan1) );
                Gia_ObjSetTravIdCurrent(p, pFan1);
                fChanges = 1;
                break;
            }
            if ( Gia_ObjIsTravIdCurrent(p, pFan1) )
            {
                Vec_IntRemove( vSupp, Gia_ObjId(p, pTemp) );
                Vec_IntPush( vSupp, Gia_ObjId(p, pFan0) );
                assert( !Gia_ObjIsTravIdCurrent(p, pFan0) );
                Gia_ObjSetTravIdCurrent(p, pFan0);
                fChanges = 1;
                break;
            }
        }
        if ( !fChanges )
            break;
    }
    return Vec_IntSize(vSupp);
}